

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::Chapters::Atom::GetTime(Chapters *pChapters,longlong timecode)

{
  SegmentInfo *this;
  longlong lVar1;
  long in_RSI;
  undefined8 *in_RDI;
  longlong result;
  longlong timecode_scale;
  SegmentInfo *pInfo;
  Segment *pSegment;
  undefined8 local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_8 = -1;
  }
  else if ((Segment *)*in_RDI == (Segment *)0x0) {
    local_8 = -1;
  }
  else {
    this = Segment::GetInfo((Segment *)*in_RDI);
    if (this == (SegmentInfo *)0x0) {
      local_8 = -1;
    }
    else {
      lVar1 = SegmentInfo::GetTimeCodeScale(this);
      if (lVar1 < 1) {
        local_8 = -1;
      }
      else if (in_RSI < 0) {
        local_8 = -1;
      }
      else {
        local_8 = lVar1 * in_RSI;
      }
    }
  }
  return local_8;
}

Assistant:

long long Chapters::Atom::GetTime(const Chapters* pChapters,
                                  long long timecode) {
  if (pChapters == NULL)
    return -1;

  Segment* const pSegment = pChapters->m_pSegment;

  if (pSegment == NULL)  // weird
    return -1;

  const SegmentInfo* const pInfo = pSegment->GetInfo();

  if (pInfo == NULL)
    return -1;

  const long long timecode_scale = pInfo->GetTimeCodeScale();

  if (timecode_scale < 1)  // weird
    return -1;

  if (timecode < 0)
    return -1;

  const long long result = timecode_scale * timecode;

  return result;
}